

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cgtAig.c
# Opt level: O0

Aig_Obj_t * Cgt_ManBuildClockGate(Aig_Man_t *pNew,Vec_Ptr_t *vGates)

{
  int iVar1;
  Aig_Obj_t *p;
  Aig_Obj_t *pAVar2;
  int local_2c;
  Aig_Obj_t *pAStack_28;
  int i;
  Aig_Obj_t *pTotal;
  Aig_Obj_t *pGate;
  Vec_Ptr_t *vGates_local;
  Aig_Man_t *pNew_local;
  
  iVar1 = Vec_PtrSize(vGates);
  if (iVar1 < 1) {
    __assert_fail("Vec_PtrSize(vGates) > 0",
                  "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/opt/cgt/cgtAig.c"
                  ,500,"Aig_Obj_t *Cgt_ManBuildClockGate(Aig_Man_t *, Vec_Ptr_t *)");
  }
  pAStack_28 = Aig_ManConst0(pNew);
  for (local_2c = 0; iVar1 = Vec_PtrSize(vGates), local_2c < iVar1; local_2c = local_2c + 1) {
    p = (Aig_Obj_t *)Vec_PtrEntry(vGates,local_2c);
    pAVar2 = Aig_Regular(p);
    if ((pAVar2->field_0).pNext == (Aig_Obj_t *)0x0) {
      pAVar2 = Aig_Regular(p);
      pAVar2 = (Aig_Obj_t *)(pAVar2->field_5).pData;
      iVar1 = Aig_IsComplement(p);
      pTotal = Aig_NotCond(pAVar2,iVar1);
    }
    else {
      pAVar2 = Aig_Regular(p);
      pAVar2 = (pAVar2->field_0).pNext;
      iVar1 = Aig_IsComplement(p);
      pTotal = Aig_NotCond(pAVar2,iVar1);
    }
    pAStack_28 = Aig_Or(pNew,pAStack_28,pTotal);
  }
  return pAStack_28;
}

Assistant:

Aig_Obj_t * Cgt_ManBuildClockGate( Aig_Man_t * pNew, Vec_Ptr_t * vGates )
{
    Aig_Obj_t * pGate, * pTotal;
    int i;
    assert( Vec_PtrSize(vGates) > 0 );
    pTotal = Aig_ManConst0(pNew);
    Vec_PtrForEachEntry( Aig_Obj_t *, vGates, pGate, i )
    {
        if ( Aig_Regular(pGate)->pNext )
            pGate = Aig_NotCond( Aig_Regular(pGate)->pNext, Aig_IsComplement(pGate) );
        else
            pGate = Aig_NotCond( (Aig_Obj_t *)Aig_Regular(pGate)->pData, Aig_IsComplement(pGate) );
        pTotal = Aig_Or( pNew, pTotal, pGate );
    }
    return pTotal;
}